

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O0

int zip_entry_fread(zip_t *zip,char *filename)

{
  mz_bool mVar1;
  int iVar2;
  undefined1 local_278 [8];
  mz_zip_archive_file_stat info;
  mz_uint32 xattr;
  mz_uint idx;
  mz_zip_archive *pzip;
  char *filename_local;
  zip_t *zip_local;
  
  info.m_comment[0xf8] = '\0';
  info.m_comment[0xf9] = '\0';
  info.m_comment[0xfa] = '\0';
  info.m_comment[0xfb] = '\0';
  if (zip == (zip_t *)0x0) {
    zip_local._4_4_ = -1;
  }
  else {
    memset(local_278,0,0x248);
    if (((zip->archive).m_zip_mode == MZ_ZIP_MODE_READING) && (-1 < (zip->entry).index)) {
      info.m_comment._252_4_ = (zip->entry).index;
      mVar1 = mz_zip_reader_is_file_a_directory(&zip->archive,info.m_comment._252_4_);
      if (mVar1 == 0) {
        mVar1 = mz_zip_reader_extract_to_file(&zip->archive,info.m_comment._252_4_,filename,0);
        if (mVar1 == 0) {
          zip_local._4_4_ = -1;
        }
        else {
          mVar1 = mz_zip_reader_file_stat
                            (&zip->archive,info.m_comment._252_4_,
                             (mz_zip_archive_file_stat *)local_278);
          if (mVar1 == 0) {
            zip_local._4_4_ = -1;
          }
          else {
            info.m_comment._248_4_ = info.m_uncomp_size._4_4_ >> 0x10;
            if ((info.m_comment._248_4_ == 0) ||
               (iVar2 = chmod(filename,info.m_comment._248_4_), -1 < iVar2)) {
              zip_local._4_4_ = 0;
            }
            else {
              zip_local._4_4_ = -1;
            }
          }
        }
      }
      else {
        zip_local._4_4_ = -1;
      }
    }
    else {
      zip_local._4_4_ = -1;
    }
  }
  return zip_local._4_4_;
}

Assistant:

int zip_entry_fread(struct zip_t *zip, const char *filename) {
  mz_zip_archive *pzip = NULL;
  mz_uint idx;
#if defined(_MSC_VER)
#else
  mz_uint32 xattr = 0;
#endif
  mz_zip_archive_file_stat info;

  if (!zip) {
    // zip_t handler is not initialized
    return -1;
  }

  memset((void *)&info, 0, sizeof(mz_zip_archive_file_stat));
  pzip = &(zip->archive);
  if (pzip->m_zip_mode != MZ_ZIP_MODE_READING || zip->entry.index < 0) {
    // the entry is not found or we do not have read access
    return -1;
  }

  idx = (mz_uint)zip->entry.index;
  if (mz_zip_reader_is_file_a_directory(pzip, idx)) {
    // the entry is a directory
    return -1;
  }

  if (!mz_zip_reader_extract_to_file(pzip, idx, filename, 0)) {
    return -1;
  }

#if defined(_MSC_VER)
#else
  if (!mz_zip_reader_file_stat(pzip, idx, &info)) {
    // Cannot get information about zip archive;
    return -1;
  }

  xattr = (info.m_external_attr >> 16) & 0xFFFF;
  if (xattr > 0) {
    if (chmod(filename, (mode_t)xattr) < 0) {
      return -1;
    }
  }
#endif

  return 0;
}